

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  parasail_result_t *ppVar8;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int32_t *piVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  char *__format;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  int iVar44;
  __m128i_32_t A;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar45;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int32_t *local_208;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  long local_1c0;
  long local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  long local_128;
  long local_120;
  ulong local_118;
  long local_110;
  long local_108;
  ulong local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 local_48 [16];
  int iVar46;
  int iVar49;
  int iVar50;
  int iVar51;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "_s2";
LAB_00558f95:
    fprintf(_stderr,__format,"parasail_sg_flags_table_diag_sse2_128_32",pcVar14);
    return (parasail_result_t *)0x0;
  }
  uVar28 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar14 = "s2Len";
    goto LAB_00558f95;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar14 = "open";
    goto LAB_00558f95;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar14 = "gap";
    goto LAB_00558f95;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "matrix";
    goto LAB_00558f95;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar14 = "_s1";
      goto LAB_00558f95;
    }
    uVar17 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar14 = "_s1Len";
      goto LAB_00558f95;
    }
  }
  else {
    uVar17 = (ulong)(uint)matrix->length;
  }
  iVar16 = (int)uVar17;
  uVar19 = s2Len + 3;
  iVar20 = -open;
  iVar7 = matrix->min;
  uVar9 = 0x80000000 - iVar7;
  if (iVar7 != iVar20 && SBORROW4(iVar7,iVar20) == iVar7 + open < 0) {
    uVar9 = open | 0x80000000;
  }
  iVar24 = uVar9 + 1;
  iVar7 = 0x7ffffffe - matrix->max;
  local_1a8 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_e8 = gap << 2;
    iStack_e4 = gap << 2;
    iStack_e0 = gap << 2;
    iStack_dc = gap << 2;
  }
  else {
    local_e8 = 0;
    iStack_e4 = 0;
    iStack_e0 = 0;
    iStack_dc = 0;
  }
  local_138._0_8_ = CONCAT44(iVar24,iVar24);
  local_138._8_8_ = CONCAT44(iVar24,iVar24);
  local_148._8_8_ = local_138._8_8_;
  local_148._0_8_ = local_138._0_8_;
  local_d8._8_8_ = local_138._8_8_;
  local_d8._0_8_ = local_138._0_8_;
  local_158._8_8_ = local_138._8_8_;
  local_158._0_8_ = local_138._0_8_;
  if (s1_beg == 0) {
    local_1a8._4_4_ = iVar20 + gap * -2;
    local_1a8._0_4_ = gap * -3 - open;
    local_1a8._12_4_ = iVar20;
    local_1a8._8_4_ = iVar20 - gap;
  }
  local_68 = gap;
  iStack_64 = gap;
  iStack_60 = gap;
  iStack_5c = gap;
  ppVar8 = parasail_result_new_table1(iVar16,s2Len);
  if (ppVar8 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar8->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar8->flag | 0x4421002;
  uVar18 = (ulong)(s2Len + 6);
  ptr = parasail_memalign_int32_t(0x10,uVar18);
  ptr_00 = parasail_memalign_int32_t(0x10,uVar18);
  ptr_01 = parasail_memalign_int32_t(0x10,uVar18);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (int32_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  lVar29 = (long)iVar16;
  if (matrix->type == 0) {
    local_208 = parasail_memalign_int32_t(0x10,(long)(iVar16 + 3));
    uVar18 = 0;
    if (local_208 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    uVar13 = 0;
    if (0 < iVar16) {
      uVar13 = uVar17;
    }
    for (; uVar13 != uVar18; uVar18 = uVar18 + 1) {
      local_208[uVar18] = matrix->mapper[(byte)_s1[uVar18]];
    }
    for (lVar11 = lVar29; lVar11 < iVar16 + 3; lVar11 = lVar11 + 1) {
      local_208[lVar11] = 0;
    }
  }
  else {
    local_208 = (int32_t *)0x0;
  }
  local_f8 = iVar7;
  iStack_f4 = iVar7;
  iStack_f0 = iVar7;
  iStack_ec = iVar7;
  local_a8 = open;
  iStack_a4 = open;
  iStack_a0 = open;
  iStack_9c = open;
  local_78 = iVar16;
  iStack_74 = iVar16;
  iStack_70 = iVar16;
  iStack_6c = iVar16;
  local_b8 = iVar16 + -1;
  iStack_b4 = iVar16 + -1;
  iStack_b0 = iVar16 + -1;
  iStack_ac = iVar16 + -1;
  local_98 = s2Len;
  iStack_94 = s2Len;
  iStack_90 = s2Len;
  iStack_8c = s2Len;
  local_88 = s2Len + -1;
  iStack_84 = s2Len + -1;
  iStack_80 = s2Len + -1;
  iStack_7c = s2Len + -1;
  piVar1 = matrix->mapper;
  for (uVar17 = 0; uVar28 != uVar17; uVar17 = uVar17 + 1) {
    ptr[uVar17 + 3] = piVar1[(byte)_s2[uVar17]];
  }
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    ptr[lVar11] = 0;
  }
  piVar12 = ptr + uVar28 + 3;
  for (uVar17 = uVar28; (int)uVar17 < (int)uVar19; uVar17 = (ulong)((int)uVar17 + 1)) {
    *piVar12 = 0;
    piVar12 = piVar12 + 1;
  }
  uVar17 = 0;
  iVar21 = iVar20;
  if (s2_beg == 0) {
    for (; uVar28 != uVar17; uVar17 = uVar17 + 1) {
      ptr_00[uVar17 + 3] = iVar21;
      ptr_01[uVar17 + 3] = iVar24;
      iVar21 = iVar21 - gap;
    }
  }
  else {
    for (; uVar28 != uVar17; uVar17 = uVar17 + 1) {
      ptr_00[uVar17 + 3] = 0;
      ptr_01[uVar17 + 3] = iVar24;
    }
  }
  for (lVar11 = 0; uVar17 = uVar28, lVar11 != 3; lVar11 = lVar11 + 1) {
    ptr_00[lVar11] = iVar24;
    ptr_01[lVar11] = iVar24;
  }
  for (; (int)uVar17 < (int)uVar19; uVar17 = uVar17 + 1) {
    ptr_00[uVar17 + 3] = iVar24;
    ptr_01[uVar17 + 3] = iVar24;
  }
  ptr_00[2] = 0;
  uVar9 = iVar16 - 1;
  auVar4._4_4_ = iVar24;
  auVar4._0_4_ = iVar24;
  auVar4._8_4_ = iVar24;
  auVar4._12_4_ = iVar24;
  local_c8 = auVar4 >> 0x20;
  if ((int)uVar19 < 1) {
    uVar19 = 0;
  }
  local_1b8 = uVar28 * 0xc + -0xc;
  local_120 = uVar28 * 0x10;
  local_128 = uVar28 * 4;
  local_1f8 = 3;
  iStack_1f4 = 2;
  iStack_1f0 = 1;
  iStack_1ec = 0;
  local_1c0 = 0;
  local_188._4_4_ = iVar7;
  local_188._0_4_ = iVar7;
  local_188._12_4_ = iVar7;
  local_188._8_4_ = iVar7;
  uVar17 = 0;
  local_158 = auVar4;
  local_d8 = auVar4;
  auVar32 = auVar4;
  local_48 = auVar4;
  auVar37 = auVar4;
  local_178 = auVar4;
  while ((long)uVar17 < lVar29) {
    local_100 = uVar17 | 3;
    uVar22 = (uint)uVar17;
    if (matrix->type == 0) {
      uVar10 = local_208[uVar17 + 1];
      uVar15 = local_208[uVar17 + 2];
      uVar27 = local_208[uVar17];
      uVar25 = local_208[local_100];
    }
    else {
      uVar10 = uVar9;
      if ((long)(uVar17 | 1) < lVar29) {
        uVar10 = uVar22 | 1;
      }
      uVar15 = uVar22 | 2;
      if (lVar29 <= (long)(uVar17 | 2)) {
        uVar15 = uVar9;
      }
      uVar27 = uVar22;
      uVar25 = uVar22 | 3;
      if (lVar29 <= (long)local_100) {
        uVar25 = uVar9;
      }
    }
    piVar1 = matrix->matrix;
    iVar21 = matrix->size;
    iVar26 = iVar20 - uVar22 * gap;
    auVar42._0_12_ = auVar4._4_12_;
    auVar42._12_4_ = ptr_00[2];
    if (s1_beg != 0) {
      iVar26 = 0;
    }
    auVar39._12_4_ = iVar26;
    auVar39._0_12_ = auVar42._0_12_;
    local_118 = uVar17 + 4;
    ptr_00[2] = iVar20 - (int)(uVar17 + 4) * gap;
    local_110 = local_128 * (uVar17 | 2) + -8;
    local_108 = local_128 * (uVar17 | 1) + -4;
    local_58 = -(uint)(iVar16 + -1 == local_1f8);
    iStack_54 = -(uint)(iVar16 + -1 == iStack_1f4);
    iStack_50 = -(uint)(iVar16 + -1 == iStack_1f0);
    iStack_4c = -(uint)(iVar16 + -1 == iStack_1ec);
    auVar30._4_4_ = iVar24;
    auVar30._0_4_ = iVar24;
    auVar30._8_4_ = iVar24;
    auVar30._12_4_ = iVar24;
    auVar54 = _DAT_008a1b30;
    auVar34 = auVar30;
    for (uVar18 = 0; uVar19 != uVar18; uVar18 = uVar18 + 1) {
      iVar26 = ptr_00[uVar18 + 3];
      auVar33._0_4_ = auVar39._4_4_ - open;
      auVar33._4_4_ = auVar39._8_4_ - open;
      auVar33._8_4_ = auVar39._12_4_ - open;
      auVar33._12_4_ = iVar26 - open;
      auVar52._0_4_ = auVar30._4_4_ - local_68;
      auVar52._4_4_ = auVar30._8_4_ - iStack_64;
      auVar52._8_4_ = auVar30._12_4_ - iStack_60;
      auVar52._12_4_ = ptr_01[uVar18 + 3] - iStack_5c;
      auVar43._0_4_ = -(uint)(auVar52._0_4_ < auVar33._0_4_);
      auVar43._4_4_ = -(uint)(auVar52._4_4_ < auVar33._4_4_);
      auVar43._8_4_ = -(uint)(auVar52._8_4_ < auVar33._8_4_);
      auVar43._12_4_ = -(uint)(auVar52._12_4_ < auVar33._12_4_);
      auVar30 = ~auVar43 & auVar52 | auVar33 & auVar43;
      auVar40._0_4_ = auVar39._0_4_ - open;
      auVar40._4_4_ = auVar39._4_4_ - open;
      auVar40._8_4_ = auVar39._8_4_ - open;
      auVar40._12_4_ = auVar39._12_4_ - open;
      auVar57._0_4_ = auVar34._0_4_ - local_68;
      auVar57._4_4_ = auVar34._4_4_ - iStack_64;
      auVar57._8_4_ = auVar34._8_4_ - iStack_60;
      auVar57._12_4_ = auVar34._12_4_ - iStack_5c;
      auVar34._0_4_ = -(uint)(auVar57._0_4_ < auVar40._0_4_);
      auVar34._4_4_ = -(uint)(auVar57._4_4_ < auVar40._4_4_);
      auVar34._8_4_ = -(uint)(auVar57._8_4_ < auVar40._8_4_);
      auVar34._12_4_ = -(uint)(auVar57._12_4_ < auVar40._12_4_);
      auVar34 = ~auVar34 & auVar57 | auVar40 & auVar34;
      auVar55._0_4_ = piVar1[(long)(int)(uVar25 * iVar21) + (long)ptr[uVar18]] + auVar42._0_4_;
      auVar55._4_4_ = piVar1[(long)(int)(uVar15 * iVar21) + (long)ptr[uVar18 + 1]] + auVar42._4_4_;
      auVar55._8_4_ = piVar1[(long)(int)(uVar10 * iVar21) + (long)ptr[uVar18 + 2]] + auVar42._8_4_;
      auVar55._12_4_ = piVar1[(long)(int)(uVar27 * iVar21) + (long)ptr[uVar18 + 3]] + auVar42._12_4_
      ;
      auVar41._0_4_ = -(uint)(auVar34._0_4_ < auVar55._0_4_);
      auVar41._4_4_ = -(uint)(auVar34._4_4_ < auVar55._4_4_);
      auVar41._8_4_ = -(uint)(auVar34._8_4_ < auVar55._8_4_);
      auVar41._12_4_ = -(uint)(auVar34._12_4_ < auVar55._12_4_);
      auVar42 = ~auVar41 & auVar34 | auVar55 & auVar41;
      auVar56._0_4_ = -(uint)(auVar30._0_4_ < auVar42._0_4_);
      auVar56._4_4_ = -(uint)(auVar30._4_4_ < auVar42._4_4_);
      auVar56._8_4_ = -(uint)(auVar30._8_4_ < auVar42._8_4_);
      auVar56._12_4_ = -(uint)(auVar30._12_4_ < auVar42._12_4_);
      auVar42 = ~auVar56 & auVar30 | auVar42 & auVar56;
      iVar46 = auVar54._0_4_;
      auVar47._0_4_ = -(uint)(iVar46 == -1);
      iVar49 = auVar54._4_4_;
      auVar47._4_4_ = -(uint)(iVar49 == -1);
      iVar50 = auVar54._8_4_;
      iVar51 = auVar54._12_4_;
      auVar47._8_4_ = -(uint)(iVar50 == -1);
      auVar47._12_4_ = -(uint)(iVar51 == -1);
      auVar43 = local_1a8 & auVar47 | ~auVar47 & auVar42;
      iVar38 = auVar43._0_4_;
      iVar23 = auVar43._4_4_;
      iVar44 = auVar43._8_4_;
      iVar45 = auVar43._12_4_;
      if (3 < uVar18) {
        auVar53._0_4_ = -(uint)(iVar38 < local_188._0_4_);
        auVar53._4_4_ = -(uint)(iVar23 < local_188._4_4_);
        auVar53._8_4_ = -(uint)(iVar44 < local_188._8_4_);
        auVar53._12_4_ = -(uint)(iVar45 < local_188._12_4_);
        local_188 = ~auVar53 & local_188 | auVar43 & auVar53;
        auVar58._0_4_ = -(uint)(iVar38 < local_178._0_4_);
        auVar58._4_4_ = -(uint)(iVar23 < local_178._4_4_);
        auVar58._8_4_ = -(uint)(iVar44 < local_178._8_4_);
        auVar58._12_4_ = -(uint)(iVar45 < local_178._12_4_);
        local_178 = local_178 & auVar58 | ~auVar58 & auVar43;
      }
      piVar2 = ((ppVar8->field_4).rowcols)->score_row;
      if (uVar18 < uVar28) {
        *(int *)((long)piVar2 + uVar18 * 4 + local_1c0) = iVar45;
      }
      if (uVar18 - 1 < uVar28 && (long)(uVar17 | 1) < lVar29) {
        *(int *)((long)piVar2 + uVar18 * 4 + local_108) = iVar44;
      }
      if (((long)(uVar17 | 2) < lVar29) && ((long)(uVar18 - 2) < (long)uVar28 && 1 < uVar18)) {
        *(int *)((long)piVar2 + uVar18 * 4 + local_110) = iVar23;
      }
      auVar5._4_4_ = iVar24;
      auVar5._0_4_ = iVar24;
      auVar5._8_4_ = iVar24;
      auVar5._12_4_ = iVar24;
      auVar30 = ~auVar47 & auVar30 | auVar5 & auVar47;
      if (2 < uVar18 && (long)local_100 < lVar29) {
        *(int *)((long)piVar2 + uVar18 * 4 + local_1b8) = iVar38;
      }
      auVar34 = auVar5 & auVar47 | ~auVar47 & auVar34;
      auVar3._4_4_ = iStack_1f4;
      auVar3._0_4_ = local_1f8;
      auVar3._8_4_ = iStack_1f0;
      auVar3._12_4_ = iStack_1ec;
      auVar35._0_4_ = -(uint)(local_1f8 < iVar16);
      auVar35._4_4_ = -(uint)(iStack_1f4 < iVar16);
      auVar35._8_4_ = -(uint)(iStack_1f0 < iVar16);
      auVar35._12_4_ = -(uint)(iStack_1ec < iVar16);
      auVar48._0_4_ = -(uint)(s2Len + -1 == iVar46);
      auVar48._4_4_ = -(uint)(s2Len + -1 == iVar49);
      auVar48._8_4_ = -(uint)(s2Len + -1 == iVar50);
      auVar48._12_4_ = -(uint)(s2Len + -1 == iVar51);
      auVar31._0_4_ = -(uint)(iVar46 < s2Len);
      auVar31._4_4_ = -(uint)(iVar49 < s2Len);
      auVar31._8_4_ = -(uint)(iVar50 < s2Len);
      auVar31._12_4_ = -(uint)(iVar51 < s2Len);
      auVar59._0_4_ = iVar46 >> 0x1f;
      auVar59._4_4_ = iVar49 >> 0x1f;
      auVar59._8_4_ = iVar50 >> 0x1f;
      auVar59._12_4_ = iVar51 >> 0x1f;
      auVar60._0_4_ = -(uint)(auVar37._0_4_ < iVar38);
      auVar60._4_4_ = -(uint)(auVar37._4_4_ < iVar23);
      auVar60._8_4_ = -(uint)(auVar37._8_4_ < iVar44);
      auVar60._12_4_ = -(uint)(auVar37._12_4_ < iVar45);
      auVar6._4_4_ = iStack_54;
      auVar6._0_4_ = local_58;
      auVar6._8_4_ = iStack_50;
      auVar6._12_4_ = iStack_4c;
      auVar60 = ~auVar59 & auVar31 & auVar6 & auVar60;
      auVar36._0_4_ = -(uint)(auVar32._0_4_ < iVar38);
      auVar36._4_4_ = -(uint)(auVar32._4_4_ < iVar23);
      auVar36._8_4_ = -(uint)(auVar32._8_4_ < iVar44);
      auVar36._12_4_ = -(uint)(auVar32._12_4_ < iVar45);
      auVar36 = auVar35 & auVar48 & auVar36;
      local_138 = auVar42 & auVar60 | ~auVar60 & auVar37;
      local_148 = auVar43 & auVar36 | ~auVar36 & auVar32;
      local_d8 = ~(auVar48 & auVar6) & local_d8 | auVar43 & auVar48 & auVar6;
      ptr_00[uVar18] = iVar38;
      ptr_01[uVar18] = auVar30._0_4_;
      local_158 = ~auVar36 & local_158 | auVar3 & auVar36;
      local_48 = ~auVar60 & local_48 | auVar54 & auVar60;
      auVar54._0_4_ = iVar46 + 1;
      auVar54._4_4_ = iVar49 + 1;
      auVar54._8_4_ = iVar50 + 1;
      auVar54._12_4_ = iVar51 + 1;
      auVar42._0_12_ = auVar39._4_12_;
      auVar42._12_4_ = iVar26;
      auVar39 = auVar43;
      auVar32 = local_148;
      auVar37 = local_138;
    }
    local_1f8 = local_1f8 + 4;
    iStack_1f4 = iStack_1f4 + 4;
    iStack_1f0 = iStack_1f0 + 4;
    iStack_1ec = iStack_1ec + 4;
    local_1a8._4_4_ = local_1a8._4_4_ - iStack_e4;
    local_1a8._0_4_ = local_1a8._0_4_ - local_e8;
    local_1a8._8_4_ = local_1a8._8_4_ - iStack_e0;
    local_1a8._12_4_ = local_1a8._12_4_ - iStack_dc;
    local_1b8 = local_1b8 + local_120;
    local_1c0 = local_1c0 + local_120;
    uVar17 = local_118;
  }
  iVar16 = 0;
  uVar19 = 0;
  iVar20 = iVar24;
  iVar26 = iVar24;
  iVar21 = iVar24;
  for (lVar29 = 0; (int)lVar29 != 4; lVar29 = lVar29 + 1) {
    iVar38 = *(int *)(local_148 + lVar29 * 4);
    if (iVar26 < iVar38) {
      uVar19 = *(uint *)(local_158 + lVar29 * 4);
      iVar26 = iVar38;
    }
    else if ((iVar38 == iVar26) && ((int)*(uint *)(local_158 + lVar29 * 4) < (int)uVar19)) {
      uVar19 = *(uint *)(local_158 + lVar29 * 4);
      iVar26 = iVar38;
    }
    if (iVar20 < *(int *)(local_138 + lVar29 * 4)) {
      iVar16 = *(int *)(local_48 + lVar29 * 4);
      iVar20 = *(int *)(local_138 + lVar29 * 4);
    }
    if (iVar21 < *(int *)(local_d8 + lVar29 * 4)) {
      iVar21 = *(int *)(local_d8 + lVar29 * 4);
    }
  }
  iVar38 = iVar16;
  if (s1_end == 0 || s2_end == 0) {
    iVar23 = s2Len + -1;
    if (s1_end != 0) goto LAB_00558ee2;
    iVar38 = iVar23;
    if (s2_end != 0) {
      iVar21 = iVar20;
      iVar38 = iVar16;
    }
  }
  else {
    if (iVar20 < iVar26) {
      iVar16 = s2Len + -1;
      iVar23 = iVar16;
      goto LAB_00558ee2;
    }
    iVar21 = iVar20;
    if ((iVar26 == iVar20) && (iVar23 = s2Len + -1, iVar16 == s2Len + -1)) goto LAB_00558ee2;
  }
  iVar26 = iVar21;
  uVar19 = uVar9;
  iVar23 = iVar38;
LAB_00558ee2:
  auVar32._0_4_ = -(uint)((int)local_188._0_4_ < iVar24);
  auVar32._4_4_ = -(uint)((int)local_188._4_4_ < iVar24);
  auVar32._8_4_ = -(uint)((int)local_188._8_4_ < iVar24);
  auVar32._12_4_ = -(uint)((int)local_188._12_4_ < iVar24);
  auVar37._0_4_ = -(uint)(iVar7 < (int)local_178._0_4_);
  auVar37._4_4_ = -(uint)(iVar7 < (int)local_178._4_4_);
  auVar37._8_4_ = -(uint)(iVar7 < (int)local_178._8_4_);
  auVar37._12_4_ = -(uint)(iVar7 < (int)local_178._12_4_);
  iVar7 = movmskps(iVar16,auVar37 | auVar32);
  if (iVar7 != 0) {
    *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
    iVar26 = 0;
    iVar23 = 0;
    uVar19 = 0;
  }
  ppVar8->score = iVar26;
  ppVar8->end_query = uVar19;
  ppVar8->end_ref = iVar23;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_208);
    return ppVar8;
  }
  return ppVar8;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}